

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

void libssh2_knownhost_free(LIBSSH2_KNOWNHOSTS *hosts)

{
  known_host *entry;
  known_host *pkVar1;
  
  entry = (known_host *)_libssh2_list_first(&hosts->head);
  while (entry != (known_host *)0x0) {
    pkVar1 = (known_host *)_libssh2_list_next(&entry->node);
    free_host(hosts->session,entry);
    entry = pkVar1;
  }
  (*hosts->session->free)(hosts,&hosts->session->abstract);
  return;
}

Assistant:

LIBSSH2_API void
libssh2_knownhost_free(LIBSSH2_KNOWNHOSTS *hosts)
{
    struct known_host *node;
    struct known_host *next;

    for(node = _libssh2_list_first(&hosts->head); node; node = next) {
        next = _libssh2_list_next(&node->node);
        free_host(hosts->session, node);
    }
    LIBSSH2_FREE(hosts->session, hosts);
}